

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_explain.c
# Opt level: O3

void version_explain(char *v,int flags)

{
  size_t sVar1;
  char **ppcVar2;
  component_t components [2];
  char *local_70;
  component_t local_68 [2];
  
  local_70 = v;
  fprintf(_stderr,"%3s %s\n","M/O","Data");
  if (*v != '\0') {
    do {
      sVar1 = get_next_version_component(&local_70,local_68,flags);
      if (sVar1 != 0) {
        ppcVar2 = &local_68[0].end;
        do {
          fprintf(_stderr,"%3d \"%.*s\"\n",(ulong)(uint)((component_t *)(ppcVar2 + -2))->metaorder,
                  (ulong)(uint)(*(int *)ppcVar2 - (int)ppcVar2[-1]));
          ppcVar2 = ppcVar2 + 3;
          sVar1 = sVar1 - 1;
        } while (sVar1 != 0);
      }
    } while (*local_70 != '\0');
  }
  return;
}

Assistant:

void version_explain(const char* v, int flags) {
    component_t components[2];

    fprintf(stderr, "%3s %s\n", "M/O", "Data");
    while (*v != '\0') {
        size_t len = get_next_version_component(&v, components, flags);

        for (size_t i = 0; i < len; i++) {
            fprintf(stderr, "%3d \"%.*s\"\n", components[i].metaorder, (int)(components[i].end - components[i].start), components[i].start);
        }
    }
}